

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lprowbase.h
# Opt level: O2

void __thiscall soplex::LPRowBase<double>::LPRowBase(LPRowBase<double> *this,int defDim)

{
  double *pdVar1;
  
  this->left = 0.0;
  pdVar1 = (double *)infinity();
  this->right = *pdVar1;
  this->object = 0.0;
  DSVectorBase<double>::DSVectorBase(&this->vec,defDim);
  return;
}

Assistant:

explicit LPRowBase(int defDim = 0)
      : left(0), right(R(infinity)), object(0), vec(defDim)
   {
      assert(isConsistent());
   }